

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O0

int GIFNextPixel(gdImagePtr im,GifCtx *ctx)

{
  int r;
  GifCtx *ctx_local;
  gdImagePtr im_local;
  
  if (ctx->CountDown == 0) {
    im_local._4_4_ = -1;
  }
  else {
    ctx->CountDown = ctx->CountDown + -1;
    im_local._4_4_ = gdImageGetPixel(im,ctx->curx,ctx->cury);
    BumpPixel(ctx);
  }
  return im_local._4_4_;
}

Assistant:

static int GIFNextPixel(gdImagePtr im, GifCtx *ctx)
{
	int r;

	if(ctx->CountDown == 0) {
		return EOF;
	}

	--(ctx->CountDown);

	r = gdImageGetPixel(im, ctx->curx, ctx->cury);

	BumpPixel(ctx);

	return r;
}